

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeCustom(AsciiParser *this)

{
  bool bVar1;
  uint64_t pos;
  bool ok;
  uint64_t loc;
  string tok;
  AsciiParser *this_local;
  
  tok.field_2._8_8_ = this;
  ::std::__cxx11::string::string((string *)&loc);
  pos = CurrLoc(this);
  bVar1 = ReadIdentifier(this,(string *)&loc);
  if (bVar1) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &loc,"custom");
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      SeekTo(this,pos);
      this_local._7_1_ = false;
    }
  }
  else {
    SeekTo(this,pos);
    this_local._7_1_ = false;
  }
  ::std::__cxx11::string::~string((string *)&loc);
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::MaybeCustom() {
  std::string tok;

  auto loc = CurrLoc();
  bool ok = ReadIdentifier(&tok);

  if (!ok) {
    // revert
    SeekTo(loc);
    return false;
  }

  if (tok == "custom") {
    // cosume `custom` token.
    return true;
  }

  // revert
  SeekTo(loc);
  return false;
}